

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlParseContentInternal(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  int iVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlParserInputPtr pxVar5;
  xmlChar *pxVar6;
  
  iVar2 = ctxt->nameNr;
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  pxVar5 = ctxt->input;
  pxVar4 = pxVar5->cur;
  do {
    xVar1 = *pxVar4;
    if ((xVar1 == '\0') || (ctxt->instate == XML_PARSER_EOF)) {
      return;
    }
    iVar3 = pxVar5->id;
    pxVar6 = pxVar4 + (pxVar5->consumed - (long)pxVar5->base);
    if (xVar1 == '&') {
      xmlParseReference(ctxt);
    }
    else if (xVar1 == '<') {
      xVar1 = pxVar4[1];
      if (xVar1 == '!') {
        if (((((pxVar4[2] == '[') && (pxVar4[3] == 'C')) && (pxVar4[4] == 'D')) &&
            ((pxVar4[5] == 'A' && (pxVar4[6] == 'T')))) &&
           ((pxVar4[7] == 'A' && (pxVar4[8] == '[')))) {
          xmlParseCDSect(ctxt);
        }
        else {
          if ((pxVar4[2] != '-') || (pxVar4[3] != '-')) goto LAB_0015f3f8;
          xmlParseComment(ctxt);
          ctxt->instate = XML_PARSER_CONTENT;
        }
      }
      else if (xVar1 == '/') {
        if (ctxt->nameNr <= iVar2) {
          return;
        }
        xmlParseElementEnd(ctxt);
      }
      else if (xVar1 == '?') {
        xmlParsePI(ctxt);
      }
      else {
LAB_0015f3f8:
        xmlParseElementStart(ctxt);
      }
    }
    else {
      xmlParseCharData(ctxt,0);
    }
    pxVar5 = ctxt->input;
    if (ctxt->progressive == 0) {
      if ((long)pxVar5->end - (long)pxVar5->cur < 0xfa) {
        xmlGROW(ctxt);
        pxVar5 = ctxt->input;
        if (ctxt->progressive != 0) goto LAB_0015f40d;
      }
      if ((500 < (long)pxVar5->cur - (long)pxVar5->base) &&
         ((long)pxVar5->end - (long)pxVar5->cur < 500)) {
        xmlSHRINK(ctxt);
        pxVar5 = ctxt->input;
      }
    }
LAB_0015f40d:
    pxVar4 = pxVar5->cur;
    if ((pxVar6 == pxVar4 + (pxVar5->consumed - (long)pxVar5->base)) && (iVar3 == pxVar5->id)) {
      xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,"detected an error in element content\n");
      xmlHaltParser(ctxt);
      return;
    }
  } while( true );
}

Assistant:

static void
xmlParseContentInternal(xmlParserCtxtPtr ctxt) {
    int nameNr = ctxt->nameNr;

    GROW;
    while ((RAW != 0) &&
	   (ctxt->instate != XML_PARSER_EOF)) {
        int id = ctxt->input->id;
	unsigned long cons = CUR_CONSUMED;
	const xmlChar *cur = ctxt->input->cur;

	/*
	 * First case : a Processing Instruction.
	 */
	if ((*cur == '<') && (cur[1] == '?')) {
	    xmlParsePI(ctxt);
	}

	/*
	 * Second case : a CDSection
	 */
	/* 2.6.0 test was *cur not RAW */
	else if (CMP9(CUR_PTR, '<', '!', '[', 'C', 'D', 'A', 'T', 'A', '[')) {
	    xmlParseCDSect(ctxt);
	}

	/*
	 * Third case :  a comment
	 */
	else if ((*cur == '<') && (NXT(1) == '!') &&
		 (NXT(2) == '-') && (NXT(3) == '-')) {
	    xmlParseComment(ctxt);
	    ctxt->instate = XML_PARSER_CONTENT;
	}

	/*
	 * Fourth case :  a sub-element.
	 */
	else if (*cur == '<') {
            if (NXT(1) == '/') {
                if (ctxt->nameNr <= nameNr)
                    break;
	        xmlParseElementEnd(ctxt);
            } else {
	        xmlParseElementStart(ctxt);
            }
	}

	/*
	 * Fifth case : a reference. If if has not been resolved,
	 *    parsing returns it's Name, create the node
	 */

	else if (*cur == '&') {
	    xmlParseReference(ctxt);
	}

	/*
	 * Last case, text. Note that References are handled directly.
	 */
	else {
	    xmlParseCharData(ctxt, 0);
	}

	GROW;
	SHRINK;

	if ((cons == CUR_CONSUMED) && (id == ctxt->input->id)) {
	    xmlFatalErr(ctxt, XML_ERR_INTERNAL_ERROR,
	                "detected an error in element content\n");
	    xmlHaltParser(ctxt);
            break;
	}
    }
}